

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

treeNode * Executor::idExp(treeNode *node)

{
  code *pcVar1;
  Var *pVVar2;
  treeNode *this;
  string local_f8;
  undefined1 local_d1;
  string local_d0;
  treeNode *local_b0;
  treeNode *tmp;
  string local_a0;
  string local_70;
  Var *local_50;
  Var *var;
  treeNode *right;
  string name;
  treeNode *left;
  treeNode *node_local;
  
  name.field_2._8_8_ = node->child[0];
  std::__cxx11::string::string((string *)&right,(string *)&node->child[1]->text);
  var = (Var *)node->child[2];
  std::__cxx11::string::string((string *)&local_70,(string *)&right);
  pVVar2 = getVar(&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  local_50 = pVVar2;
  if (name.field_2._8_8_ == 0) {
    if (var == (Var *)0x0) {
      if (pVVar2->kind == Integer) {
        node_local = (treeNode *)operator_new(0x58);
        treeNode::treeNode(node_local,(local_50->value).integer);
      }
      else if (pVVar2->kind == Decmical) {
        node_local = (treeNode *)operator_new(0x58);
        treeNode::treeNode(node_local,(local_50->value).decmical);
      }
      else if (pVVar2->kind == Boolean) {
        node_local = (treeNode *)operator_new(0x58);
        treeNode::treeNode(node_local,(bool)((local_50->value).boolean & 1));
      }
      else {
        if (pVVar2->kind != Text) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        node_local = (treeNode *)operator_new(0x58);
        std::__cxx11::string::string((string *)&local_f8,(string *)&local_50->text);
        treeNode::treeNode(node_local,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
      }
    }
    else {
      this = (treeNode *)operator_new(0x58);
      local_d1 = 1;
      std::__cxx11::string::string((string *)&local_d0,(string *)&right);
      treeNode::treeNode(this,idExp,&local_d0);
      local_d1 = 0;
      std::__cxx11::string::~string((string *)&local_d0);
      local_b0 = this;
      if (local_50->kind == Integer) {
        (local_50->value).integer = (local_50->value).integer + 1;
      }
      else if (local_50->kind == Decmical) {
        (local_50->value).decmical = (local_50->value).decmical + 1.0;
      }
      else {
        reportError(errorType);
      }
      node_local = local_b0;
    }
  }
  else {
    if (pVVar2->kind == Integer) {
      (pVVar2->value).integer = (pVVar2->value).integer + 1;
    }
    else if (pVVar2->kind == Decmical) {
      (pVVar2->value).decmical = (pVVar2->value).decmical + 1.0;
    }
    else {
      reportError(errorType);
    }
    node_local = (treeNode *)operator_new(0x58);
    tmp._7_1_ = 1;
    std::__cxx11::string::string((string *)&local_a0,(string *)&right);
    treeNode::treeNode(node_local,idExp,&local_a0);
    tmp._7_1_ = 0;
    std::__cxx11::string::~string((string *)&local_a0);
  }
  tmp._0_4_ = 1;
  std::__cxx11::string::~string((string *)&right);
  return node_local;
}

Assistant:

treeNode* idExp(treeNode* node)
    {
        auto left = node->child[0];
        auto name = node->child[1]->text;
        auto right = node->child[2];
        auto var = getVar(name);
        if(left!=nullptr)
        {
            if(var->kind==AttrKind::Integer)
            {
                var->value.integer++;
            }
            else if(var->kind==AttrKind::Decmical)
            {
                var->value.decmical++;
            }
            else reportError(Error::errorType);
            return new treeNode(ExpKind::idExp,name);
        }
        if(right!=nullptr)
        {
            auto tmp = new treeNode(ExpKind::idExp,name);
            if(var->kind==AttrKind::Integer)
            {
                var->value.integer++;
            }
            else if(var->kind==AttrKind::Decmical)
            {
                var->value.decmical++;
            }
            else reportError(Error::errorType);
            return tmp;
        }

        if(var->kind==AttrKind::Integer)       return new treeNode(var->value.integer);
        else if(var->kind==AttrKind::Decmical) return new treeNode(var->value.decmical);
        else if(var->kind==AttrKind::Boolean)  return new treeNode(var->value.boolean);
        else if(var->kind==AttrKind::Text)     return new treeNode(var->text);
    }